

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusmenuadaptor.cpp
# Opt level: O2

void __thiscall
QDBusMenuAdaptor::Event
          (QDBusMenuAdaptor *this,int id,QString *eventId,QDBusVariant *data,uint timestamp)

{
  Data *pDVar1;
  bool bVar2;
  QDBusPlatformMenuItem *this_00;
  QLoggingCategory *pQVar3;
  QDebug *pQVar4;
  QDBusMenuAdaptor *pQVar5;
  long in_FS_OFFSET;
  Data *in_stack_ffffffffffffff88;
  QLatin1StringView local_60;
  undefined4 uStack_50;
  undefined4 local_4c;
  char *local_48;
  QDebug local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = QDBusPlatformMenuItem::byId((int)((ulong)in_stack_ffffffffffffff88 >> 0x20));
  pQVar3 = QtPrivateLogging::qLcMenu();
  if (((pQVar3->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
    local_48 = pQVar3->name;
    local_60.m_size._0_4_ = 2;
    local_60.m_size._4_4_ = 0;
    local_60.m_data._0_4_ = 0;
    local_60.m_data._4_4_ = 0;
    uStack_50 = 0;
    local_4c = 0;
    QMessageLogger::debug();
    pQVar4 = QDebug::operator<<(&local_40,id);
    if (this_00 == (QDBusPlatformMenuItem *)0x0) {
      QString::QString((QString *)&stack0xffffffffffffff88,
                       (QLatin1StringView)(ZEXT816(0x5c6f59) << 0x40));
    }
    else {
      pDVar1 = (this_00->m_text).d.d;
      if (pDVar1 != (Data *)0x0) {
        LOCK();
        (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    pQVar4 = QDebug::operator<<(pQVar4,(QString *)&stack0xffffffffffffff88);
    QDebug::operator<<(pQVar4,eventId);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)&stack0xffffffffffffff88);
    QDebug::~QDebug(&local_40);
  }
  if (this_00 != (QDBusPlatformMenuItem *)0x0) {
    local_60.m_size._0_4_ = 7;
    local_60.m_size._4_4_ = 0;
    local_60.m_data._0_4_ = 0x618e87;
    local_60.m_data._4_4_ = 0;
    bVar2 = ::operator==(eventId,&local_60);
    if (bVar2) {
      QDBusPlatformMenuItem::trigger((QDBusPlatformMenuItem *)this_00);
    }
    local_60.m_size._0_4_ = 7;
    local_60.m_size._4_4_ = 0;
    local_60.m_data._0_4_ = 0x618e8f;
    local_60.m_data._4_4_ = 0;
    bVar2 = ::operator==(eventId,&local_60);
    if (bVar2) {
      QPlatformMenuItem::hovered(&this_00->super_QPlatformMenuItem);
    }
  }
  local_60.m_size._0_4_ = 6;
  local_60.m_size._4_4_ = 0;
  local_60.m_data._0_4_ = 0x618e97;
  local_60.m_data._4_4_ = 0;
  bVar2 = ::operator==(eventId,&local_60);
  if (bVar2) {
    if (this_00 == (QDBusPlatformMenuItem *)0x0) {
      if (id != 0) goto LAB_00588d46;
      pQVar5 = this + 0x10;
    }
    else {
      pQVar5 = (QDBusMenuAdaptor *)&this_00->m_subMenu;
    }
    if (*(QPlatformMenu **)pQVar5 != (QPlatformMenu *)0x0) {
      QPlatformMenu::aboutToHide(*(QPlatformMenu **)pQVar5);
    }
  }
LAB_00588d46:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDBusMenuAdaptor::Event(int id, const QString &eventId, const QDBusVariant &data, uint timestamp)
{
    Q_UNUSED(data);
    Q_UNUSED(timestamp);
    QDBusPlatformMenuItem *item = QDBusPlatformMenuItem::byId(id);
    qCDebug(qLcMenu) << id << (item ? item->text() : ""_L1) << eventId;
    if (item && eventId == "clicked"_L1)
        item->trigger();
    if (item && eventId == "hovered"_L1)
        emit item->hovered();
    if (eventId == "closed"_L1) {
        // There is no explicit AboutToHide method, so map closed event to aboutToHide method
        const QDBusPlatformMenu *menu = nullptr;
        if (item)
            menu = static_cast<const QDBusPlatformMenu *>(item->menu());
        else if (id == 0)
            menu = m_topLevelMenu;
        if (menu)
            emit const_cast<QDBusPlatformMenu *>(menu)->aboutToHide();
    }
}